

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<int,kj::StringPtr>::Callbacks>::
find<kj::HashMap<int,kj::StringPtr>::Entry,int&>
          (HashIndex<kj::HashMap<int,kj::StringPtr>::Callbacks> *this,
          ArrayPtr<kj::HashMap<int,_kj::StringPtr>::Entry> table,int *params)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar4;
  uint uVar5;
  StringPtr *pSVar6;
  ulong uVar7;
  int *in_R8;
  Maybe<unsigned_long> MVar8;
  
  pSVar6 = table.ptr;
  aVar4.value = table.size_;
  if (pSVar6[1].content.size_ != 0) {
    uVar3 = hashCode<int&>(in_R8);
    pcVar2 = pSVar6[1].content.ptr;
    aVar4 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)pSVar6[1].content.size_;
    uVar5 = (int)aVar4.value - 1U & uVar3;
    while( true ) {
      uVar7 = (ulong)uVar5;
      iVar1 = *(int *)(pcVar2 + uVar7 * 8 + 4);
      if (iVar1 == 0) break;
      if (((iVar1 != 1) && (*(uint *)(pcVar2 + uVar7 * 8) == uVar3)) &&
         (*(int *)(table.size_ + (ulong)(iVar1 - 2) * 0x18) == *in_R8)) {
        *this = (HashIndex<kj::HashMap<int,kj::StringPtr>::Callbacks>)0x1;
        *(ulong *)(this + 8) = (ulong)(iVar1 - 2);
        goto LAB_0016ffad;
      }
      uVar5 = (uint)(uVar7 + 1);
      if (uVar7 + 1 == aVar4.value) {
        uVar5 = 0;
      }
    }
  }
  *this = (HashIndex<kj::HashMap<int,kj::StringPtr>::Callbacks>)0x0;
LAB_0016ffad:
  MVar8.ptr.field_1.value = aVar4.value;
  MVar8.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar8.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }